

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::urem(APInt *this,APInt *RHS)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  APInt *in_RDX;
  uint64_t val;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint lhsWords;
  APInt AVar5;
  
  uVar2 = RHS->BitWidth;
  if (uVar2 != in_RDX->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x658,"APInt llvm::APInt::urem(const APInt &) const");
  }
  if (uVar2 < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Remainder by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x65a,"APInt llvm::APInt::urem(const APInt &) const");
    }
    val = (RHS->U).VAL % (in_RDX->U).VAL;
  }
  else {
    uVar2 = getActiveBits(RHS);
    uVar3 = getActiveBits(in_RDX);
    if (uVar3 == 0) {
      __assert_fail("rhsWords && \"Performing remainder operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x664,"APInt llvm::APInt::urem(const APInt &) const");
    }
    if ((uVar2 != 0) && (uVar3 != 1)) {
      lhsWords = (uint)((ulong)uVar2 + 0x3f >> 6);
      uVar3 = (uint)((ulong)uVar3 + 0x3f >> 6);
      if ((lhsWords < uVar3) || (bVar1 = ult(RHS,in_RDX), bVar1)) {
        APInt(this,RHS);
        uVar4 = extraout_RDX_00;
        goto LAB_0019c767;
      }
      bVar1 = operator==(RHS,in_RDX);
      if (!bVar1) {
        uVar2 = RHS->BitWidth;
        if (lhsWords != 1) {
          APInt(this,uVar2,0,false);
          divide((RHS->U).pVal,lhsWords,(in_RDX->U).pVal,uVar3,(WordType *)0x0,(this->U).pVal);
          uVar4 = extraout_RDX_01;
          goto LAB_0019c767;
        }
        val = *(RHS->U).pVal % *(in_RDX->U).pVal;
        goto LAB_0019c760;
      }
    }
    uVar2 = RHS->BitWidth;
    val = 0;
  }
LAB_0019c760:
  APInt(this,uVar2,val,false);
  uVar4 = extraout_RDX;
LAB_0019c767:
  AVar5._8_8_ = uVar4;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt APInt::urem(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Remainder by zero?");
    return APInt(BitWidth, U.VAL % RHS.U.VAL);
  }

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Get some facts about the RHS
  unsigned rhsBits = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing remainder operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X % 1 ===> 0
    return APInt(BitWidth, 0);
  if (lhsWords < rhsWords || this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return *this;
  if (*this == RHS)
    // X % X == 0;
    return APInt(BitWidth, 0);
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return APInt(BitWidth, U.pVal[0] % RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Remainder(BitWidth, 0);
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, nullptr, Remainder.U.pVal);
  return Remainder;
}